

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
extract_chunk_leader
          (exr_const_context_t_conflict ctxt,exr_const_priv_part_t part,int partnum,uint64_t offset,
          uint64_t *next_offset,priv_chunk_leader *leaderdata)

{
  uint8_t uVar1;
  exr_storage_t eVar2;
  bool bVar3;
  exr_result_t eVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint64_t uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  uint64_t nextoffset;
  int64_t deep_data [3];
  int32_t data [6];
  uint64_t local_80;
  long local_78;
  long local_70;
  long local_68;
  int local_58 [8];
  uint64_t *local_38;
  
  lVar12 = 0x7fffffff;
  if (0 < ctxt->file_size) {
    lVar12 = ctxt->file_size;
  }
  eVar2 = part->storage_mode;
  if (eVar2 == EXR_STORAGE_SCANLINE) {
LAB_0012d844:
    lVar9 = ((ulong)(eVar2 != EXR_STORAGE_DEEP_SCANLINE) - (ulong)(ctxt->is_multipart == '\0')) + 2;
  }
  else {
    if (eVar2 == EXR_STORAGE_DEEP_TILED) {
      uVar1 = ctxt->is_multipart;
      lVar9 = 5;
    }
    else {
      if (eVar2 == EXR_STORAGE_DEEP_SCANLINE) goto LAB_0012d844;
      uVar1 = ctxt->is_multipart;
      lVar9 = 6;
    }
    lVar9 = lVar9 - (ulong)(uVar1 == '\0');
  }
  local_80 = offset;
  local_38 = next_offset;
  eVar4 = (*ctxt->do_read)(ctxt,local_58,lVar9 << 2,&local_80,(int64_t *)0x0,EXR_MUST_READ_ALL);
  if (eVar4 != 0) {
    return eVar4;
  }
  uVar6 = 0;
  iVar11 = 0;
  if ((ctxt->is_multipart != '\0') && (uVar6 = 1, iVar11 = partnum, local_58[0] != partnum)) {
    eVar4 = (*ctxt->print_error)
                      (ctxt,0x16,
                       "Invalid part number reconstructing chunk table: expect %d, found %d",
                       (ulong)(uint)partnum);
    return eVar4;
  }
  leaderdata->partnum = iVar11;
  lVar9 = 4;
  uVar5 = uVar6;
  if ((part->storage_mode & ~EXR_STORAGE_DEEP_SCANLINE) != EXR_STORAGE_SCANLINE) {
    *(undefined8 *)&leaderdata->field_1 = *(undefined8 *)(local_58 + uVar6);
    uVar5 = uVar6 + 3;
    (leaderdata->field_1).field_1.level_x = local_58[(ulong)uVar6 + 2];
    lVar9 = 0x10;
  }
  *(int *)(leaderdata->_pad + lVar9 + -0x14) = local_58[uVar5];
  if ((part->storage_mode & ~EXR_STORAGE_TILED) != EXR_STORAGE_DEEP_SCANLINE) {
    uVar8 = (uint64_t)local_58[(ulong)uVar5 + 1];
    if (((long)uVar8 < 0) || (lVar12 < (long)uVar8)) {
      eVar4 = (*ctxt->print_error)
                        (ctxt,0x16,
                         "Invalid chunk size reconstructing chunk table: found out of range %d");
      return eVar4;
    }
    leaderdata->packed_size = uVar8;
    uVar6 = 0;
    goto LAB_0012d9f8;
  }
  bVar3 = false;
  uVar6 = (*ctxt->do_read)(ctxt,&local_78,0x18,&local_80,(int64_t *)0x0,EXR_MUST_READ_ALL);
  uVar7 = (ulong)uVar6;
  if (uVar6 == 0) {
    if ((local_78 < 0) || ((local_78 == 0 && (local_68 != 0 || local_70 != 0)))) {
      pcVar10 = "Invalid chunk size reconstructing chunk table: found out of range sample count %ld"
      ;
    }
    else {
      if ((local_70 <= lVar12 && -1 < local_70) && ((local_70 != 0 || (local_68 == 0)))) {
        uVar7 = local_70 + local_78;
        leaderdata->packed_size = uVar7;
        bVar3 = true;
        goto LAB_0012d9ef;
      }
      pcVar10 = "Invalid chunk size reconstructing chunk table: found out of range %ld";
      local_78 = local_70;
    }
    bVar3 = false;
    uVar5 = (*ctxt->print_error)(ctxt,0x16,pcVar10,local_78);
    uVar7 = (ulong)uVar5;
  }
LAB_0012d9ef:
  if (!bVar3) {
    return (exr_result_t)uVar7;
  }
LAB_0012d9f8:
  *local_38 = local_80 + leaderdata->packed_size;
  return uVar6;
}

Assistant:

static exr_result_t
extract_chunk_leader (
    exr_const_context_t       ctxt,
    exr_const_priv_part_t     part,
    int                       partnum,
    uint64_t                  offset,
    uint64_t*                 next_offset,
    struct priv_chunk_leader* leaderdata)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    int32_t      data[6];
    uint64_t     nextoffset = offset;
    int          rdcnt, ntoread;
    int64_t      maxval = (int64_t) INT_MAX; // 2GB

    if (ctxt->file_size > 0) maxval = ctxt->file_size;

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        ntoread = (ctxt->is_multipart) ? 2 : 1;
        if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) ++ntoread;
    }
    else if (part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (ctxt->is_multipart)
            ntoread = 5;
        else
            ntoread = 4;
    }
    else if (ctxt->is_multipart)
        ntoread = 6;
    else
        ntoread = 5;

    rv = ctxt->do_read (
        ctxt,
        data,
        (size_t) ntoread * sizeof (int32_t),
        &nextoffset,
        NULL,
        EXR_MUST_READ_ALL);
    if (rv != EXR_ERR_SUCCESS) return rv;

    priv_to_native32 (data, ntoread);

    rdcnt = 0;
    if (ctxt->is_multipart)
    {
        if (data[rdcnt] != partnum)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid part number reconstructing chunk table: expect %d, found %d",
                partnum,
                data[rdcnt]);
        }
        leaderdata->partnum = partnum;
        ++rdcnt;
    }
    else
        leaderdata->partnum = 0;

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        leaderdata->scanline_y = data[rdcnt];
    }
    else
    {
        leaderdata->tile_x  = data[rdcnt++];
        leaderdata->tile_y  = data[rdcnt++];
        leaderdata->level_x = data[rdcnt++];
        leaderdata->level_y = data[rdcnt];
    }

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        int64_t deep_data[3];

        rv = ctxt->do_read (
            ctxt,
            deep_data,
            3 * sizeof (int64_t),
            &nextoffset,
            NULL,
            EXR_MUST_READ_ALL);

        if (rv != EXR_ERR_SUCCESS) return rv;
        priv_to_native64 (deep_data, 3);

        if (deep_data[0] < 0 || (deep_data[0] == 0 && (deep_data[1] != 0 || deep_data[2] != 0)))
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid chunk size reconstructing chunk table: found out of range sample count %" PRId64,
                deep_data[0]);
        }
        if (deep_data[1] < 0 || deep_data[1] > maxval ||
            (deep_data[1] == 0 && deep_data[2] != 0))
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid chunk size reconstructing chunk table: found out of range %" PRId64,
                deep_data[1]);
        }
        leaderdata->packed_size = (uint64_t) deep_data[0] + (uint64_t) deep_data[1];
    }
    else
    {
        ++rdcnt;

        if (data[rdcnt] < 0 || data[rdcnt] > maxval)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid chunk size reconstructing chunk table: found out of range %d",
                data[rdcnt]);
        }
        leaderdata->packed_size = (uint64_t) data[rdcnt];
    }
    nextoffset += leaderdata->packed_size;

    *next_offset = nextoffset;
    return rv;
}